

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O1

LY_ERR lysp_check_date(lysp_ctx *ctx,char *date,size_t date_len,char *stmt)

{
  int iVar1;
  ushort **ppuVar2;
  char *pcVar3;
  LY_ERR unaff_EBP;
  ly_ctx *plVar4;
  uint8_t i;
  long lVar5;
  tm tm;
  tm tm_;
  tm local_a8;
  tm local_68;
  
  if (date == (char *)0x0) {
    if (ctx == (lysp_ctx *)0x0) {
      plVar4 = (ly_ctx *)0x0;
    }
    else {
      plVar4 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_log(plVar4,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","date","lysp_check_date");
  }
  else if (date_len == 10) {
    lVar5 = 0;
    do {
      if (((char)lVar5 == '\a') || (((uint)lVar5 & 0xff) == 4)) {
        if (date[lVar5] != '-') goto LAB_00161de6;
      }
      else {
        ppuVar2 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar2 + (long)date[lVar5] * 2 + 1) & 8) == 0) {
LAB_00161de6:
          iVar1 = 5;
          goto LAB_00161deb;
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 10);
    iVar1 = 2;
LAB_00161deb:
    if (iVar1 != 5) {
      if (iVar1 != 2) {
        return unaff_EBP;
      }
      local_a8.tm_isdst = 0;
      local_a8._36_4_ = 0;
      local_a8.tm_gmtoff = 0;
      local_a8.tm_mon = 0;
      local_a8.tm_year = 0;
      local_a8.tm_wday = 0;
      local_a8.tm_yday = 0;
      local_a8.tm_sec = 0;
      local_a8.tm_min = 0;
      local_a8.tm_hour = 0;
      local_a8.tm_mday = 0;
      local_a8.tm_zone = (char *)0x0;
      pcVar3 = strptime(date,"%Y-%m-%d",&local_a8);
      if (pcVar3 == date + 10 && pcVar3 != (char *)0x0) {
        local_68.tm_gmtoff = local_a8.tm_gmtoff;
        local_68.tm_zone = local_a8.tm_zone;
        local_68.tm_mon = local_a8.tm_mon;
        local_68.tm_year = local_a8.tm_year;
        local_68.tm_wday = local_a8.tm_wday;
        local_68.tm_yday = local_a8.tm_yday;
        local_68.tm_sec = local_a8.tm_sec;
        local_68.tm_min = local_a8.tm_min;
        local_68.tm_hour = local_a8.tm_hour;
        local_68.tm_mday = local_a8.tm_mday;
        local_68._36_4_ = local_a8._36_4_;
        local_68.tm_isdst = -1;
        mktime(&local_68);
        if (local_a8.tm_mday == local_68.tm_mday) {
          return LY_SUCCESS;
        }
      }
    }
    if (stmt != (char *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        plVar4 = (ly_ctx *)0x0;
      }
      else {
        plVar4 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_vlog(plVar4,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",10,date,stmt);
    }
  }
  else {
    if (ctx == (lysp_ctx *)0x0) {
      plVar4 = (ly_ctx *)0x0;
    }
    else {
      plVar4 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(plVar4,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid length %u of a date.",date_len);
  }
  return LY_EINVAL;
}

Assistant:

LY_ERR
lysp_check_date(struct lysp_ctx *ctx, const char *date, size_t date_len, const char *stmt)
{
    struct tm tm, tm_;
    char *r;

    LY_CHECK_ARG_RET(PARSER_CTX(ctx), date, LY_EINVAL);

    if (date_len != LY_REV_SIZE - 1) {
        LOGVAL_PARSER(ctx, LYVE_SYNTAX_YANG, "Invalid length %" PRIu32 " of a date.", (uint32_t)date_len);
        return LY_EINVAL;
    }

    /* check format: YYYY-MM-DD */
    for (uint8_t i = 0; i < date_len; i++) {
        if ((i == 4) || (i == 7)) {
            if (date[i] != '-') {
                goto error;
            }
        } else if (!isdigit(date[i])) {
            goto error;
        }
    }

    /* check content, e.g. 2018-02-31 */
    memset(&tm, 0, sizeof tm);
    r = strptime(date, "%Y-%m-%d", &tm);
    if (!r || (r != &date[LY_REV_SIZE - 1])) {
        goto error;
    }
    memcpy(&tm_, &tm, sizeof tm);

    /* Disabling DST: Set tm_isdst to -1 so that mktime() won't adjust for daylight saving time. */
    tm_.tm_isdst = -1;

    mktime(&tm_); /* mktime modifies tm_ if it refers invalid date */
    if (tm.tm_mday != tm_.tm_mday) { /* e.g 2018-02-29 -> 2018-03-01 */
        /* checking days is enough, since other errors
         * have been checked by strptime() */
        goto error;
    }

    return LY_SUCCESS;

error:
    if (stmt) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)date_len, date, stmt);
    }
    return LY_EINVAL;
}